

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ImGui::PushFont(ImFont *font)

{
  ImFont **ppIVar1;
  ImGuiContext *pIVar2;
  int iVar3;
  ImFont **__dest;
  int iVar4;
  int iVar5;
  
  pIVar2 = GImGui;
  if (font == (ImFont *)0x0) {
    font = GetDefaultFont();
  }
  SetCurrentFont(font);
  iVar3 = (pIVar2->FontStack).Size;
  if (iVar3 == (pIVar2->FontStack).Capacity) {
    if (iVar3 == 0) {
      iVar4 = 8;
    }
    else {
      iVar4 = iVar3 / 2 + iVar3;
    }
    iVar5 = iVar3 + 1;
    if (iVar3 + 1 < iVar4) {
      iVar5 = iVar4;
    }
    GImAllocatorActiveAllocationsCount = GImAllocatorActiveAllocationsCount + 1;
    __dest = (ImFont **)(*GImAllocatorAllocFunc)((long)iVar5 << 3,GImAllocatorUserData);
    ppIVar1 = (pIVar2->FontStack).Data;
    if (ppIVar1 != (ImFont **)0x0) {
      memcpy(__dest,ppIVar1,(long)(pIVar2->FontStack).Size << 3);
      ppIVar1 = (pIVar2->FontStack).Data;
      if (ppIVar1 != (ImFont **)0x0) {
        GImAllocatorActiveAllocationsCount = GImAllocatorActiveAllocationsCount - 1;
      }
      (*GImAllocatorFreeFunc)(ppIVar1,GImAllocatorUserData);
    }
    (pIVar2->FontStack).Data = __dest;
    (pIVar2->FontStack).Capacity = iVar5;
    iVar3 = (pIVar2->FontStack).Size;
  }
  else {
    __dest = (pIVar2->FontStack).Data;
  }
  __dest[iVar3] = font;
  (pIVar2->FontStack).Size = (pIVar2->FontStack).Size + 1;
  ImDrawList::PushTextureID(pIVar2->CurrentWindow->DrawList,font->ContainerAtlas->TexID);
  return;
}

Assistant:

void ImGui::PushFont(ImFont* font)
{
    ImGuiContext& g = *GImGui;
    if (!font)
        font = GetDefaultFont();
    SetCurrentFont(font);
    g.FontStack.push_back(font);
    g.CurrentWindow->DrawList->PushTextureID(font->ContainerAtlas->TexID);
}